

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

Txid * __thiscall cfd::core::Block::GetTxid(Txid *__return_storage_ptr__,Block *this,uint32_t index)

{
  size_type sVar1;
  undefined8 uVar2;
  const_reference object;
  Txid *pTVar3;
  CfdError error_code;
  allocator local_41;
  string local_40 [36];
  uint local_1c;
  Block *pBStack_18;
  uint32_t index_local;
  Block *this_local;
  
  pTVar3 = __return_storage_ptr__;
  local_1c = index;
  pBStack_18 = this;
  this_local = (Block *)__return_storage_ptr__;
  sVar1 = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::size(&this->txids_);
  if ((uint)sVar1 <= local_1c) {
    uVar2 = __cxa_allocate_exception(0x30);
    error_code = (CfdError)((ulong)pTVar3 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_40,"The index is outside the scope of the txid list.",&local_41);
    CfdException::CfdException((CfdException *)this,error_code,(string *)__return_storage_ptr__);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  object = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::operator[]
                     (&this->txids_,(ulong)local_1c);
  Txid::Txid(__return_storage_ptr__,object);
  return pTVar3;
}

Assistant:

Txid Block::GetTxid(uint32_t index) const {
  if (static_cast<uint32_t>(txids_.size()) <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "The index is outside the scope of the txid list.");
  }
  return txids_[index];
}